

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O0

void __thiscall TinyGC::SetGCPhase(TinyGC *this,GCPhase gc_phase)

{
  GCPhase gc_phase_local;
  TinyGC *this_local;
  
  if (gc_phase == kNone) {
    if (this->gc_phase_ != kSweeping) {
      __assert_fail("gc_phase_ == GCPhase::kSweeping",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/v4kst1z[P]TinyGC/TinyGC.cpp"
                    ,0x4c,"void TinyGC::SetGCPhase(GCPhase)");
    }
  }
  else if (gc_phase == kMarking) {
    if (this->gc_phase_ != kNone) {
      __assert_fail("gc_phase_ == GCPhase::kNone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/v4kst1z[P]TinyGC/TinyGC.cpp"
                    ,0x4f,"void TinyGC::SetGCPhase(GCPhase)");
    }
  }
  else if ((gc_phase == kSweeping) && (this->gc_phase_ != kMarking)) {
    __assert_fail("gc_phase_ == GCPhase::kMarking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/v4kst1z[P]TinyGC/TinyGC.cpp"
                  ,0x52,"void TinyGC::SetGCPhase(GCPhase)");
  }
  this->gc_phase_ = gc_phase;
  return;
}

Assistant:

void TinyGC::SetGCPhase(GCPhase gc_phase) {
  switch (gc_phase) {
    case GCPhase::kNone:
      assert(gc_phase_ == GCPhase::kSweeping);
      break;
    case GCPhase::kMarking:
      assert(gc_phase_ == GCPhase::kNone);
      break;
    case GCPhase::kSweeping:
      assert(gc_phase_ == GCPhase::kMarking);
      break;
  }
  gc_phase_ = gc_phase;
}